

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t *
Aig_ManPartitionSmart(Aig_Man_t *p,int nSuppSizeLimit,int fVerbose,Vec_Ptr_t **pvPartSupps)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p_00;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  uint *pBuffer;
  void *pvVar8;
  uint i;
  char *p_03;
  Vec_Ptr_t *vPartsAll;
  int iVar9;
  Aig_Man_t *pAVar10;
  uint uVar11;
  
  p_03 = (char *)(ulong)(uint)nSuppSizeLimit;
  aVar3 = Abc_Clock();
  pAVar10 = p;
  p_00 = Aig_ManSupports(p);
  iVar9 = (int)pAVar10;
  if (fVerbose != 0) {
    Abc_Print(iVar9,"%s =","Supps");
    aVar4 = Abc_Clock();
    p_03 = "%9.2f sec\n";
    Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  }
  pVVar5 = Vec_PtrAlloc(1000);
  aVar3 = Abc_Clock();
  p_01 = Vec_PtrAlloc(0x100);
  p_02 = Vec_PtrAlloc(0x100);
  iVar9 = p_00->nSize;
  for (uVar11 = 0; (int)uVar11 < iVar9; uVar11 = uVar11 + 1) {
    vPartsAll = (Vec_Ptr_t *)(ulong)uVar11;
    p_03 = (char *)Vec_PtrEntry(p_00,uVar11);
    iVar1 = Vec_IntPop((Vec_Int_t *)p_03);
    iVar2 = Aig_ManPartitionSmartFindPart(p_02,vPartsAll,pVVar5,nSuppSizeLimit,(Vec_Int_t *)p_03);
    if (iVar2 == -1) {
      pVVar6 = Vec_IntAlloc(0x20);
      Vec_IntPush(pVVar6,iVar1);
      pVVar7 = Vec_IntDup((Vec_Int_t *)p_03);
      Vec_PtrPush(p_01,pVVar6);
      Vec_PtrPush(p_02,pVVar7);
      p_03 = (char *)Aig_ManSuppCharStart((Vec_Int_t *)p_03,p->nObjs[2]);
      Vec_PtrPush(pVVar5,p_03);
    }
    else {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_01,iVar2);
      Vec_IntPush(pVVar6,iVar1);
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar2);
      pVVar7 = Vec_IntTwoMerge(pVVar6,(Vec_Int_t *)p_03);
      Vec_IntFree(pVVar6);
      Vec_PtrWriteEntry(p_02,iVar2,pVVar7);
      pBuffer = (uint *)Vec_PtrEntry(pVVar5,iVar2);
      Aig_ManSuppCharAdd(pBuffer,(Vec_Int_t *)p_03,p->nObjs[2]);
    }
  }
  uVar11 = pVVar5->nSize;
  i = 0;
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  for (; uVar11 != i; i = i + 1) {
    p_03 = (char *)(ulong)i;
    pvVar8 = Vec_PtrEntry(pVVar5,i);
    free(pvVar8);
  }
  Vec_PtrFree(pVVar5);
  iVar9 = (int)pVVar5;
  if (fVerbose != 0) {
    Abc_Print(iVar9,"%s =","Parts");
    aVar4 = Abc_Clock();
    p_03 = "%9.2f sec\n";
    Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  }
  Abc_Clock();
  iVar9 = p_02->nSize;
  for (uVar11 = 0; (int)uVar11 < iVar9; uVar11 = uVar11 + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_02,uVar11);
    p_03 = (char *)(ulong)uVar11;
    Vec_IntPush(pVVar6,uVar11);
  }
  Vec_VecSort((Vec_Vec_t *)p_02,(int)p_03);
  pVVar5 = Vec_PtrAlloc(0x100);
  for (iVar1 = 0; iVar1 < iVar9; iVar1 = iVar1 + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar1);
    iVar2 = Vec_IntPop(pVVar6);
    pvVar8 = Vec_PtrEntry(p_01,iVar2);
    Vec_PtrPush(pVVar5,pvVar8);
  }
  Vec_PtrFree(p_01);
  Aig_ManPartitionCompact(pVVar5,p_02,nSuppSizeLimit);
  if (fVerbose != 0) {
    printf("Created %d partitions.\n",(ulong)(uint)pVVar5->nSize);
  }
  Vec_VecFree((Vec_Vec_t *)p_00);
  if (pvPartSupps == (Vec_Ptr_t **)0x0) {
    Vec_VecFree((Vec_Vec_t *)p_02);
  }
  else {
    *pvPartSupps = p_02;
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmart( Aig_Man_t * p, int nSuppSizeLimit, int fVerbose, Vec_Ptr_t ** pvPartSupps )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;//, * vPartPtr;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // compute the supports for all outputs
clk = Abc_Clock();
    vSupports = Aig_ManSupports( p );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Aig_ManCiNum(p)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Aig_ManCiNum(p) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
    else
        *pvPartSupps = vPartSuppsAll;
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}